

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O2

CURLcode Curl_get_pathname(char **cpp,char **path,char *homedir)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  byte *__s;
  byte bVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  pcVar4 = *cpp;
  if (*pcVar4 == '\0') {
    *cpp = (char *)0x0;
  }
  else {
    sVar2 = strspn(pcVar4," \t\r\n");
    pbVar10 = (byte *)(pcVar4 + sVar2);
    sVar2 = strlen((char *)pbVar10);
    sVar3 = strlen(homedir);
    pcVar4 = (char *)(*Curl_cmalloc)(sVar3 + sVar2 + 2);
    *path = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar1 = *pbVar10;
    if ((bVar1 != 0x27) && (bVar1 != 0x22)) {
      __s = (byte *)strpbrk((char *)pbVar10," \t\r\n");
      if (__s == (byte *)0x0) {
        sVar2 = strlen((char *)pbVar10);
        __s = pbVar10 + sVar2;
      }
      sVar2 = strspn((char *)__s," \t\r\n");
      *cpp = (char *)(__s + sVar2);
      if (((*pbVar10 == 0x2f) && (pbVar10[1] == 0x7e)) && (pbVar10[2] == 0x2f)) {
        strcpy(*path,homedir);
        sVar2 = strlen(homedir);
        lVar6 = sVar2 + 1;
        (*path)[sVar2] = '/';
        (*path)[sVar2 + 1] = '\0';
        pbVar10 = pbVar10 + 3;
      }
      else {
        lVar6 = 0;
      }
      sVar2 = (size_t)((int)__s - (int)pbVar10);
      memcpy(*path + lVar6,pbVar10,sVar2);
      (*path)[sVar2 + lVar6] = '\0';
      return CURLE_OK;
    }
    pbVar10 = pbVar10 + 1;
    uVar8 = 0;
    uVar9 = 0;
    while( true ) {
      uVar7 = (uint)uVar8;
      sVar2 = strlen((char *)pbVar10);
      if (sVar2 < uVar8) break;
      bVar5 = pbVar10[uVar8];
      if (bVar5 == bVar1) {
        uVar8 = (ulong)(uVar7 + 1);
        (*path)[uVar9] = '\0';
        break;
      }
      if (bVar5 == 0x5c) {
        uVar7 = uVar7 + 1;
        bVar5 = pbVar10[uVar7];
        if ((0x3a < bVar5 - 0x22) ||
           ((0x400000000000021U >> ((ulong)(bVar5 - 0x22) & 0x3f) & 1) == 0)) goto LAB_0013fe14;
      }
      else if (bVar5 == 0) goto LAB_0013fe14;
      (*path)[uVar9] = bVar5;
      uVar8 = (ulong)(uVar7 + 1);
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    if ((int)uVar9 != 0) {
      sVar2 = strspn((char *)(pbVar10 + uVar8)," \t\r\n");
      *cpp = (char *)(pbVar10 + uVar8 + sVar2);
      return CURLE_OK;
    }
LAB_0013fe14:
    (*Curl_cfree)(*path);
  }
  *path = (char *)0x0;
  return CURLE_QUOTE_ERROR;
}

Assistant:

CURLcode Curl_get_pathname(const char **cpp, char **path, char *homedir)
{
  const char *cp = *cpp, *end;
  char quot;
  unsigned int i, j;
  size_t fullPathLength, pathLength;
  bool relativePath = false;
  static const char WHITESPACE[] = " \t\r\n";

  if(!*cp) {
    *cpp = NULL;
    *path = NULL;
    return CURLE_QUOTE_ERROR;
  }
  /* Ignore leading whitespace */
  cp += strspn(cp, WHITESPACE);
  /* Allocate enough space for home directory and filename + separator */
  fullPathLength = strlen(cp) + strlen(homedir) + 2;
  *path = malloc(fullPathLength);
  if(*path == NULL)
    return CURLE_OUT_OF_MEMORY;

  /* Check for quoted filenames */
  if(*cp == '\"' || *cp == '\'') {
    quot = *cp++;

    /* Search for terminating quote, unescape some chars */
    for(i = j = 0; i <= strlen(cp); i++) {
      if(cp[i] == quot) {  /* Found quote */
        i++;
        (*path)[j] = '\0';
        break;
      }
      if(cp[i] == '\0') {  /* End of string */
        /*error("Unterminated quote");*/
        goto fail;
      }
      if(cp[i] == '\\') {  /* Escaped characters */
        i++;
        if(cp[i] != '\'' && cp[i] != '\"' &&
            cp[i] != '\\') {
          /*error("Bad escaped character '\\%c'",
              cp[i]);*/
          goto fail;
        }
      }
      (*path)[j++] = cp[i];
    }

    if(j == 0) {
      /*error("Empty quotes");*/
      goto fail;
    }
    *cpp = cp + i + strspn(cp + i, WHITESPACE);
  }
  else {
    /* Read to end of filename - either to white space or terminator */
    end = strpbrk(cp, WHITESPACE);
    if(end == NULL)
      end = strchr(cp, '\0');
    /* return pointer to second parameter if it exists */
    *cpp = end + strspn(end, WHITESPACE);
    pathLength = 0;
    relativePath = (cp[0] == '/' && cp[1] == '~' && cp[2] == '/');
    /* Handling for relative path - prepend home directory */
    if(relativePath) {
      strcpy(*path, homedir);
      pathLength = strlen(homedir);
      (*path)[pathLength++] = '/';
      (*path)[pathLength] = '\0';
      cp += 3;
    }
    /* Copy path name up until first "white space" */
    memcpy(&(*path)[pathLength], cp, (int)(end - cp));
    pathLength += (int)(end - cp);
    (*path)[pathLength] = '\0';
  }
  return CURLE_OK;

  fail:
  Curl_safefree(*path);
  return CURLE_QUOTE_ERROR;
}